

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

err_t rngESHealth(void)

{
  bool bVar1;
  bool bVar2;
  err_t eVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    eVar3 = rngESTest(*(char **)((long)&PTR_anon_var_dwarf_4b30_0014fd80 + lVar5));
    if (lVar5 != 0) break;
    lVar5 = 8;
  } while (eVar3 != 0);
  if (eVar3 == 0) {
LAB_00110cb9:
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    bVar1 = false;
    do {
      eVar3 = rngESTest((char *)((long)&DAT_0013d344 + (long)*(int *)((long)&DAT_0013d344 + lVar5)))
      ;
      bVar2 = bVar1;
      if ((eVar3 == 0) && (bVar2 = true, bVar1)) goto LAB_00110cb9;
      bVar1 = bVar2;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    uVar4 = bVar1 | 0x12e;
  }
  return uVar4;
}

Assistant:

err_t rngESHealth()
{
	const char* sources[] = { "sys", "sys2", "timer" };
	size_t valid_sources = 0;
	size_t pos;
	// есть работоспособный физический источник?
	if (rngESHealth2() == ERR_OK)
		return ERR_OK;
	// проверить остальные источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
	{
		if (rngESTest(sources[pos]) != ERR_OK)
			continue;
		// два работоспособных источника?
		if (++valid_sources == 2)
			return ERR_OK;
	}
	// только один?
	if (valid_sources == 1)
		return ERR_NOT_ENOUGH_ENTROPY;
	// ни одного
	return ERR_BAD_ENTROPY;
}